

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  ScopedMessage *this_local;
  
  bVar1 = uncaught_exceptions();
  if ((!bVar1) && ((this->m_moved & 1U) == 0)) {
    pIVar2 = getResultCapture();
    (*pIVar2->_vptr_IResultCapture[0xb])(pIVar2,this);
  }
  MessageInfo::~MessageInfo(&this->m_info);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }